

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTWaveBank_GetState(FACTWaveBank *pWaveBank,uint32_t *pdwState)

{
  uint32_t uVar1;
  long lVar2;
  
  if (pWaveBank == (FACTWaveBank *)0x0) {
    *pdwState = 0;
    uVar1 = 1;
  }
  else {
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    *pdwState = 4;
    if (pWaveBank->entryCount != 0) {
      lVar2 = 0;
      do {
        if (pWaveBank->entryRefs[lVar2] != 0) {
          *pdwState = 0x84;
          break;
        }
        lVar2 = lVar2 + 1;
      } while (pWaveBank->entryCount != (uint32_t)lVar2);
    }
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t FACTWaveBank_GetState(
	FACTWaveBank *pWaveBank,
	uint32_t *pdwState
) {
	uint32_t i;
	if (pWaveBank == NULL)
	{
		*pdwState = 0;
		return 1;
	}

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);

	*pdwState = FACT_STATE_PREPARED;
	for (i = 0; i < pWaveBank->entryCount; i += 1)
	{
		if (pWaveBank->entryRefs[i] > 0)
		{
			*pdwState |= FACT_STATE_INUSE;
			FAudio_PlatformUnlockMutex(
				pWaveBank->parentEngine->apiLock
			);
			return 0;
		}
	}

	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}